

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int extraout_EAX;
  int *piVar2;
  char *pcVar3;
  FILE *__stream;
  char *__format;
  long lVar4;
  ulong uVar5;
  epoll_event ev;
  sigset_t sw;
  sigset_t all;
  
  cfg.prog = *argv;
  cfg.pid = getpid();
  while( true ) {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"vp:a:h"), iVar1 == 0x61) {
        cfg.addr = inet_addr(_optarg);
      }
      if (iVar1 != 0x70) break;
      cfg.port = atoi(_optarg);
    }
    if (iVar1 != 0x76) break;
    cfg.verbose = cfg.verbose + 1;
  }
  if (((iVar1 != -1) || (cfg.addr == 0xffffffff)) || (cfg.port == 0)) {
    usage();
    return extraout_EAX;
  }
  cfg.subprocess_argv = argv + _optind;
  cfg.subprocess_argc = argc - _optind;
  if (cfg.verbose != 0) {
    for (uVar5 = 0; (long)uVar5 < (long)cfg.subprocess_argc; uVar5 = uVar5 + 1) {
      fprintf(_stderr,"subprocess: argv[%d]: %s\n",uVar5 & 0xffffffff,cfg.subprocess_argv[uVar5]);
    }
  }
  sigfillset((sigset_t *)&all);
  sigprocmask(2,(sigset_t *)&all,(sigset_t *)0x0);
  sigemptyset((sigset_t *)&sw);
  for (lVar4 = 0; lVar4 != 0x1c; lVar4 = lVar4 + 4) {
    sigaddset((sigset_t *)&sw,*(int *)((long)sigs + lVar4));
  }
  iVar1 = setup_listener();
  if (iVar1 == 0) {
    cfg.signal_fd = signalfd(-1,(sigset_t *)&sw,0);
    __stream = _stderr;
    if (cfg.signal_fd == -1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      __format = "signalfd: %s\n";
    }
    else {
      cfg.epoll_fd = epoll_create(1);
      __stream = _stderr;
      if (cfg.epoll_fd != -1) {
        iVar1 = add_epoll(1,cfg.listener_fd);
        if ((iVar1 == 0) && (iVar1 = add_epoll(1,cfg.signal_fd), iVar1 == 0)) {
          alarm(1);
          do {
            iVar1 = epoll_wait(cfg.epoll_fd,(epoll_event *)&ev,1,-1);
            __stream = _stderr;
            if (iVar1 < 1) {
              piVar2 = __errno_location();
              pcVar3 = strerror(*piVar2);
              __format = "epoll_wait: %s\n";
              goto LAB_00101b07;
            }
            if (ev.data.fd == cfg.signal_fd) {
              iVar1 = handle_signal();
            }
            else {
              if (ev.data.fd != cfg.listener_fd) {
                fwrite("Unexpected file descriptor from epoll\n",0x26,1,_stderr);
                break;
              }
              iVar1 = accept_client();
            }
          } while (-1 < iVar1);
        }
        goto LAB_00101b14;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      __format = "epoll: %s\n";
    }
LAB_00101b07:
    fprintf(__stream,__format,pcVar3);
  }
LAB_00101b14:
  if (cfg.listener_fd != -1) {
    close(cfg.listener_fd);
  }
  if (cfg.epoll_fd != -1) {
    close(cfg.epoll_fd);
  }
  if (cfg.signal_fd != -1) {
    close(cfg.signal_fd);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  cfg.prog = argv[0];
  cfg.prog=argv[0];
  cfg.pid = getpid();
  int n, opt, sc;
  struct epoll_event ev;

  while ( (opt=getopt(argc,argv,"vp:a:h")) != -1) {
    switch(opt) {
      case 'v': cfg.verbose++; break;
      case 'p': cfg.port=atoi(optarg); break; 
      case 'a': cfg.addr=inet_addr(optarg); break; 
      case 'h': default: usage(); break;
    }
  }
  if (cfg.addr == INADDR_NONE) usage();
  if (cfg.port==0) usage();
  /* advance argv/argc to subprocess name and arguments */
  cfg.subprocess_argv = argv + optind;
  cfg.subprocess_argc = argc - optind;
  if (cfg.verbose) {
    for(n = 0; n < cfg.subprocess_argc; n++) {
      fprintf(stderr, "subprocess: argv[%d]: %s\n", n, cfg.subprocess_argv[n]);
    }
  }

  /* block all signals. we take signals synchronously via signalfd */
  sigset_t all;
  sigfillset(&all);
  sigprocmask(SIG_SETMASK,&all,NULL);

  /* a few signals we'll accept via our signalfd */
  sigset_t sw;
  sigemptyset(&sw);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigaddset(&sw, sigs[n]);

  if (setup_listener()) goto done;

  /* create the signalfd for receiving signals */
  cfg.signal_fd = signalfd(-1, &sw, 0);
  if (cfg.signal_fd == -1) {
    fprintf(stderr,"signalfd: %s\n", strerror(errno));
    goto done;
  }

  /* set up the epoll instance */
  cfg.epoll_fd = epoll_create(1); 
  if (cfg.epoll_fd == -1) {
    fprintf(stderr,"epoll: %s\n", strerror(errno));
    goto done;
  }

  /* add descriptors of interest */
  if (add_epoll(EPOLLIN, cfg.listener_fd)) goto done;
  if (add_epoll(EPOLLIN, cfg.signal_fd)) goto done;

  /*
   * This is our main loop. epoll for input or signals.
   */
  alarm(1);
  while (epoll_wait(cfg.epoll_fd, &ev, 1, -1) > 0) {

    if (ev.data.fd == cfg.signal_fd) { 
      sc = handle_signal();
      if (sc < 0) goto done;
    }
    else if (ev.data.fd == cfg.listener_fd) { 
      sc = accept_client();
      if (sc < 0) goto done;
    }
    else {
      fprintf(stderr, "Unexpected file descriptor from epoll\n");
      goto done;
    }
  }

  fprintf(stderr, "epoll_wait: %s\n", strerror(errno));

 done:   /* we get here if we got a signal like Ctrl-C */
  if (cfg.listener_fd != -1) close(cfg.listener_fd);
  if (cfg.epoll_fd != -1) close(cfg.epoll_fd);
  if (cfg.signal_fd != -1) close(cfg.signal_fd);
  return 0;
}